

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_shared_mutex.hpp
# Opt level: O3

void __thiscall
yamc::fair::detail::shared_mutex_base<yamc::rwlock::TaskFairness>::impl_unlock
          (shared_mutex_base<yamc::rwlock::TaskFairness> *this)

{
  ulong uVar1;
  shared_mutex_base<yamc::rwlock::TaskFairness> *psVar2;
  
  if (((this->queue_).next == &this->locked_) && (((this->locked_).status & 3) == 2)) {
    wq_pop_locknode(this);
    psVar2 = (shared_mutex_base<yamc::rwlock::TaskFairness> *)(this->queue_).next;
    while ((psVar2 != this && (uVar1 = (psVar2->queue_).status, ((uint)uVar1 & 3) == 1))) {
      (psVar2->queue_).status = uVar1 | 2;
      psVar2 = (shared_mutex_base<yamc::rwlock::TaskFairness> *)(psVar2->queue_).next;
    }
    std::condition_variable::notify_all();
    return;
  }
  __assert_fail("queue_.next == &locked_ && (locked_.status & node_status_mask) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_shared_mutex.hpp"
                ,0xe9,
                "void yamc::fair::detail::shared_mutex_base<yamc::rwlock::TaskFairness>::impl_unlock() [RwLockFairness = yamc::rwlock::TaskFairness]"
               );
}

Assistant:

void impl_unlock()
  {
    YAMC_DEBUG_DUMPQ(">>unlock", &locked_, -1);
    assert(queue_.next == &locked_ && (locked_.status & node_status_mask) == 2);
    wq_pop_locknode();
    if (!wq_empty()) {
      // mark subsequent shared-lock nodes as 'lockable'
      if (RwLockFairness::phased) {
        //
        // PhaseFairness: move up to the front and mark all shared-lock nodes,
        // when next phase is shared-lock.
        //
        if ((queue_.next->status & node_status_mask) == 1) {
          node sentinel = {~std::size_t(0), 0, 0};
          wq_push_back(&sentinel);
          node* p = queue_.next;
          while (p != &sentinel) {
            node* next = p->next;
            if ((p->status & node_status_mask) == 0) {
              wq_erase(p);
              wq_push_back(p);
            } else {
              assert((p->status & node_status_mask) == 1);
              p->status |= 2;
            }
            p = next;
          }
          wq_erase(&sentinel);
        }
      } else {
        //
        // TaskFairness: mark directly subsequent shared-lock nodes group.
        //
        node* p = queue_.next;
        while (p != &queue_ && (p->status & node_status_mask) == 1) {
          p->status |= 2;
          p = p->next;
        }
      }
    }
    cv_.notify_all();
    YAMC_DEBUG_DUMPQ("<<unlock");
  }